

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_verify(secp256k1_ge *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  secp256k1_fe *a_00;
  ulong unaff_RBP;
  undefined8 uVar109;
  secp256k1_fe *psVar110;
  secp256k1_fe *a_01;
  secp256k1_ge *a_02;
  undefined8 uVar111;
  secp256k1_ge *a_03;
  secp256k1_ge *psVar112;
  secp256k1_fe *psVar113;
  secp256k1_fe *a_04;
  secp256k1_ge *psVar114;
  secp256k1_ge *r;
  secp256k1_ge *a_05;
  ulong uVar115;
  ulong uVar116;
  ulong unaff_R15;
  undefined1 auVar117 [16];
  undefined1 auStack_220 [56];
  uint64_t uStack_1e8;
  uint64_t uStack_1e0;
  uint64_t uStack_1d8;
  uint64_t uStack_1d0;
  undefined8 uStack_1c8;
  int iStack_1c4;
  secp256k1_fe *psStack_1c0;
  secp256k1_ge *psStack_1b8;
  code *pcStack_1b0;
  secp256k1_ge_storage sStack_1a8;
  secp256k1_fe *psStack_168;
  code *pcStack_158;
  undefined8 uStack_150;
  ulong uStack_148;
  ulong uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined1 auStack_128 [16];
  undefined8 uStack_118;
  ulong uStack_110;
  secp256k1_fe *psStack_108;
  ulong uStack_100;
  secp256k1_fe *psStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  ulong uStack_d0;
  secp256k1_ge *psStack_c8;
  
  secp256k1_fe_verify(&a->x);
  psVar113 = &a->y;
  secp256k1_fe_verify(psVar113);
  secp256k1_fe_verify_magnitude(&a->x,4);
  psVar110 = (secp256k1_fe *)0x3;
  secp256k1_fe_verify_magnitude(psVar113,3);
  if ((uint)a->infinity < 2) {
    return;
  }
  secp256k1_ge_verify_cold_1();
  if ((int)psVar110 < 0) {
    secp256k1_fe_verify_magnitude_cold_2();
  }
  else if (psVar113->magnitude <= (int)psVar110) {
    return;
  }
  secp256k1_fe_verify_magnitude_cold_1();
  secp256k1_fe_verify(psVar110);
  a_01 = (secp256k1_fe *)0x8;
  a_04 = psVar110;
  secp256k1_fe_verify_magnitude(psVar110,8);
  uVar106 = psVar110->n[0];
  if (uVar106 >> 0x38 == 0) {
    a_01 = (secp256k1_fe *)psVar110->n[1];
    if ((secp256k1_fe *)0xffffffffffffff < a_01) goto LAB_0014029a;
    unaff_R15 = psVar110->n[2];
    if (0xffffffffffffff < unaff_R15) goto LAB_0014029f;
    a = (secp256k1_ge *)psVar110->n[3];
    if ((secp256k1_ge *)0xffffffffffffff < a) goto LAB_001402a4;
    uVar1 = psVar110->n[4];
    if (uVar1 >> 0x34 == 0) {
      uVar2 = uVar106 * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = a;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = unaff_R15;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (long)a_01 * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar1;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar1;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = SUB168(auVar7 * auVar58,0);
      auVar117 = auVar6 * auVar57 + auVar5 * auVar56 + auVar8 * ZEXT816(0x1000003d10);
      uVar1 = uVar1 * 2;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar1;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar106;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = a;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = (long)a_01 * 2;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = unaff_R15;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = unaff_R15;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = SUB168(auVar7 * auVar58,8);
      auVar96 = auVar12 * ZEXT816(0x1000003d10000) +
                auVar9 * auVar59 + auVar11 * auVar61 + auVar10 * auVar60 + (auVar117 >> 0x34);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar106;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar106;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar1;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = a_01;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = a;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = unaff_R15 * 2;
      auVar97 = auVar15 * auVar64 + auVar14 * auVar63 + (auVar96 >> 0x34);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = (auVar97._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar96._6_2_ & 0xf);
      auVar26 = auVar16 * ZEXT816(0x1000003d1) + auVar13 * auVar62;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = a_01;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar2;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar1;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = unaff_R15;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = a;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = a;
      auVar97 = auVar19 * auVar67 + auVar18 * auVar66 + (auVar97 >> 0x34);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auVar97._0_8_ & 0xfffffffffffff;
      auVar27 = (auVar26 >> 0x34) + auVar20 * ZEXT816(0x1000003d10) + auVar17 * auVar65;
      uVar106 = auVar27._0_8_;
      uVar116 = auVar27._8_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = unaff_R15;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar2;
      auVar98._8_8_ = uVar116 >> 0x34;
      auVar98._0_8_ = uVar116 * 0x1000 | uVar106 >> 0x34;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = a_01;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = a_01;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar1;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = a;
      auVar97 = auVar23 * auVar70 + (auVar97 >> 0x34);
      psVar113->n[0] = auVar26._0_8_ & 0xfffffffffffff;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar97._0_8_;
      psVar113->n[1] = uVar106 & 0xfffffffffffff;
      auVar98 = auVar24 * ZEXT816(0x1000003d10) + auVar22 * auVar69 + auVar21 * auVar68 + auVar98;
      auVar26 = auVar98 >> 0x34;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = auVar26._0_8_;
      auVar100._8_8_ = auVar26._8_8_;
      auVar100._0_8_ = auVar117._0_8_ & 0xffffffffffffe;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = auVar97._8_8_;
      psVar113->n[2] = auVar98._0_8_ & 0xfffffffffffff;
      auVar101 = auVar25 * ZEXT816(0x1000003d10000) + auVar100 + auVar101;
      uVar106 = auVar101._0_8_;
      psVar113->n[3] = uVar106 & 0xfffffffffffff;
      psVar113->n[4] = (auVar101._8_8_ << 0xc | uVar106 >> 0x34) + (auVar96._0_8_ & 0xffffffffffff);
      psVar113->magnitude = 1;
      psVar113->normalized = 0;
      secp256k1_fe_verify(psVar113);
      return;
    }
  }
  else {
    secp256k1_fe_sqr_cold_5();
LAB_0014029a:
    secp256k1_fe_sqr_cold_4();
LAB_0014029f:
    secp256k1_fe_sqr_cold_3();
LAB_001402a4:
    secp256k1_fe_sqr_cold_2();
  }
  secp256k1_fe_sqr_cold_1();
  pcStack_158 = (code *)0x1402d0;
  psStack_c8 = a;
  secp256k1_fe_verify(a_01);
  pcStack_158 = (code *)0x1402d8;
  secp256k1_fe_verify(a_00);
  pcStack_158 = (code *)0x1402e5;
  secp256k1_fe_verify_magnitude(a_01,8);
  uVar106 = 8;
  pcStack_158 = (code *)0x1402f2;
  psVar113 = a_00;
  secp256k1_fe_verify_magnitude(a_00,8);
  if (a_04 == a_00) {
    pcStack_158 = (code *)0x1407c8;
    secp256k1_fe_mul_cold_16();
LAB_001407c8:
    pcStack_158 = (code *)0x1407cd;
    secp256k1_fe_mul_cold_15();
LAB_001407cd:
    pcStack_158 = (code *)0x1407d2;
    secp256k1_fe_mul_cold_14();
LAB_001407d2:
    pcStack_158 = (code *)0x1407d7;
    secp256k1_fe_mul_cold_13();
LAB_001407d7:
    pcStack_158 = (code *)0x1407dc;
    secp256k1_fe_mul_cold_12();
LAB_001407dc:
    pcStack_158 = (code *)0x1407e1;
    secp256k1_fe_mul_cold_11();
LAB_001407e1:
    pcStack_158 = (code *)0x1407e6;
    secp256k1_fe_mul_cold_10();
LAB_001407e6:
    pcStack_158 = (code *)0x1407eb;
    secp256k1_fe_mul_cold_9();
LAB_001407eb:
    pcStack_158 = (code *)0x1407f0;
    secp256k1_fe_mul_cold_8();
LAB_001407f0:
    pcStack_158 = (code *)0x1407f5;
    secp256k1_fe_mul_cold_7();
LAB_001407f5:
    pcStack_158 = (code *)0x1407fa;
    secp256k1_fe_mul_cold_6();
    uVar107 = unaff_RBP;
LAB_001407fa:
    pcStack_158 = (code *)0x1407ff;
    secp256k1_fe_mul_cold_5();
    auVar97._8_8_ = uStack_118;
    auVar97._0_8_ = uStack_150;
    auVar96._8_8_ = uStack_138;
    auVar96._0_8_ = uStack_d8;
    auVar117._8_8_ = uVar106;
    auVar117._0_8_ = psVar113;
    psVar110 = a_04;
LAB_001407ff:
    uStack_118 = auVar97._8_8_;
    uStack_150 = auVar97._0_8_;
    uStack_138 = auVar96._8_8_;
    uStack_d8 = auVar96._0_8_;
    auVar103._8_8_ = psVar110;
    auVar103._0_8_ = unaff_R15;
    pcStack_158 = (code *)0x140804;
    secp256k1_fe_mul_cold_4();
    auVar97._8_8_ = uStack_118;
    auVar97._0_8_ = uStack_150;
    auVar96._8_8_ = uStack_138;
    auVar96._0_8_ = uStack_d8;
    auVar99._8_8_ = auVar117._8_8_;
    auVar99._0_8_ = uVar107;
    psVar110 = auVar117._0_8_;
LAB_00140804:
    a_04 = psVar110;
    uStack_118 = auVar97._8_8_;
    uStack_150 = auVar97._0_8_;
    uStack_138 = auVar96._8_8_;
    uStack_d8 = auVar96._0_8_;
    uVar111 = auVar99._8_8_;
    uVar109 = auVar99._0_8_;
    pcStack_158 = (code *)0x140809;
    secp256k1_fe_mul_cold_3();
    auVar97._8_8_ = uStack_118;
    auVar97._0_8_ = uStack_150;
    auVar96._8_8_ = uStack_138;
    auVar96._0_8_ = uStack_d8;
    auVar99._8_8_ = uVar111;
    auVar99._0_8_ = uVar109;
LAB_00140809:
    uStack_118 = auVar97._8_8_;
    uStack_150 = auVar97._0_8_;
    uStack_138 = auVar96._8_8_;
    uStack_d8 = auVar96._0_8_;
    a_02 = auVar99._8_8_;
    pcStack_158 = (code *)0x14080e;
    secp256k1_fe_mul_cold_2();
    auVar97._8_8_ = uStack_118;
    auVar97._0_8_ = uStack_150;
    auVar96._8_8_ = uStack_138;
    auVar96._0_8_ = uStack_d8;
  }
  else {
    if (a_01 == a_00) goto LAB_001407c8;
    uVar1 = a_01->n[0];
    if (uVar1 >> 0x38 != 0) goto LAB_001407cd;
    unaff_R15 = 0xffffffffffffff;
    uVar2 = a_01->n[1];
    if (0xffffffffffffff < uVar2) goto LAB_001407d2;
    psVar113 = (secp256k1_fe *)a_01->n[2];
    if ((secp256k1_fe *)0xffffffffffffff < psVar113) goto LAB_001407d7;
    uVar116 = a_01->n[3];
    if (0xffffffffffffff < uVar116) goto LAB_001407dc;
    uVar106 = a_01->n[4];
    if (uVar106 >> 0x34 != 0) goto LAB_001407e1;
    a_01 = (secp256k1_fe *)a_00->n[0];
    if ((secp256k1_fe *)0xffffffffffffff < a_01) goto LAB_001407e6;
    unaff_RBP = a_00->n[1];
    if (0xffffffffffffff < unaff_RBP) goto LAB_001407eb;
    uVar3 = a_00->n[2];
    if (0xffffffffffffff < uVar3) goto LAB_001407f0;
    uVar4 = a_00->n[3];
    if (0xffffffffffffff < uVar4) goto LAB_001407f5;
    uVar108 = a_00->n[4];
    uVar107 = unaff_RBP;
    if (0xfffffffffffff < uVar108) goto LAB_001407fa;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar4;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar1;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar3;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar2;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = unaff_RBP;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = psVar113;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = a_01;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar116;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar108;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar106;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = SUB168(auVar30 * auVar75,0);
    auVar26 = auVar31 * ZEXT816(0x1000003d10) +
              auVar26 * auVar71 + auVar27 * auVar72 + auVar29 * auVar74 + auVar28 * auVar73;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar108;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar1;
    uStack_130 = SUB168(auVar32 * auVar76,0);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar4;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar2;
    auVar96 = auVar33 * auVar77;
    uStack_138 = auVar96._8_8_;
    uStack_d8 = auVar96._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar3;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = psVar113;
    uStack_e0 = SUB168(auVar34 * auVar78,8);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = unaff_RBP;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar116;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = a_01;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar106;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = SUB168(auVar30 * auVar75,8);
    auVar27 = auVar37 * ZEXT816(0x1000003d10000) +
              auVar32 * auVar76 +
              auVar96 + auVar34 * auVar78 + auVar36 * auVar80 + auVar35 * auVar79 +
              (auVar26 >> 0x34);
    auStack_128._8_8_ = 0;
    auStack_128._0_8_ = a_01;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar1;
    auStack_128 = auStack_128 * auVar81;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar108;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar2;
    auVar97 = auVar38 * auVar82;
    uStack_118 = auVar97._8_8_;
    uStack_150 = auVar97._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar4;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = psVar113;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar3;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar116;
    uVar107 = SUB168(auVar40 * auVar84,0);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = unaff_RBP;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar106;
    auVar117 = (auVar27 >> 0x34) +
               auVar97 + auVar39 * auVar83 + auVar41 * auVar85 + auVar40 * auVar84;
    unaff_R15 = auVar117._0_8_ * 0x10 & 0xfffffffffffff0U | (ulong)(auVar27._6_2_ & 0xf);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = unaff_R15;
    auVar28 = auVar42 * ZEXT816(0x1000003d1) + auStack_128;
    uVar108 = auVar28._0_8_;
    uVar115 = auVar28._8_8_;
    a_04->n[0] = uVar108 & 0xfffffffffffff;
    auVar102._8_8_ = uVar115 >> 0x34;
    auVar102._0_8_ = uVar115 * 0x1000 | uVar108 >> 0x34;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar1;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = a_00->n[1];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar2;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = a_00->n[0];
    auVar28 = auVar43 * auVar86 + auVar102 + auVar44 * auVar87;
    a_01 = auVar28._0_8_;
    psVar110 = SUB168(auVar39 * auVar83,0);
    uStack_148 = uVar106;
    uStack_140 = uVar2;
    uStack_110 = uVar116;
    psStack_108 = psVar113;
    uStack_100 = uVar1;
    psStack_f8 = a_04;
    uStack_f0 = uVar4;
    uStack_e8 = uVar3;
    uStack_d0 = unaff_RBP;
    if (auVar28._8_8_ >> 0x32 != 0) goto LAB_001407ff;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = psVar113;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = a_00->n[4];
    auVar117 = auVar45 * auVar88 + (auVar117 >> 0x34);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar116;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = a_00->n[3];
    auVar103 = auVar46 * auVar89 + auVar117;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar106;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = a_00->n[2];
    auVar99 = auVar47 * auVar90 + auVar117 + auVar46 * auVar89;
    psVar110 = (secp256k1_fe *)0xffffffffffffffff;
    if (0x3ffffffffffff < auVar99._8_8_) goto LAB_00140804;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auVar99._0_8_ & 0xfffffffffffff;
    auVar28 = auVar28 + auVar48 * ZEXT816(0x1000003d10);
    a_04->n[1] = auVar28._0_8_ & 0xfffffffffffff;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar1;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = a_00->n[2];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar2;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = a_00->n[1];
    auVar117 = auVar49 * auVar91 + (auVar28 >> 0x34) + auVar50 * auVar92;
    auVar103._8_8_ = 0xfffffffffffff;
    auVar103._0_8_ = auVar117._0_8_;
    a_01 = auVar117._8_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = psVar113;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = a_00->n[0];
    auVar117 = auVar117 + auVar51 * auVar93;
    if (0x3ffffffffffff < auVar117._8_8_) goto LAB_00140809;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar116;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = a_00->n[4];
    auVar28 = auVar52 * auVar94 + (auVar99 >> 0x34);
    a_01 = auVar28._8_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar106;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = a_00->n[3];
    auVar28 = auVar28 + auVar53 * auVar95;
    a_02 = auVar28._8_8_;
    if (a_02 < (secp256k1_ge *)0x4000000000000) {
      auVar54._8_8_ = 0;
      auVar54._0_8_ = auVar28._0_8_;
      auVar117 = auVar117 + auVar54 * ZEXT816(0x1000003d10);
      auVar96 = auVar117 >> 0x34;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = auVar96._0_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = a_02;
      auVar104._8_8_ = auVar96._8_8_;
      auVar104._0_8_ = auVar26._0_8_ & 0xfffffffffffff;
      a_04->n[2] = auVar117._0_8_ & 0xfffffffffffff;
      auVar105 = auVar55 * ZEXT816(0x1000003d10000) + auVar104 + auVar105;
      uVar106 = auVar105._0_8_;
      a_04->n[3] = uVar106 & 0xfffffffffffff;
      a_04->n[4] = (auVar105._8_8_ << 0xc | uVar106 >> 0x34) + (auVar27._0_8_ & 0xffffffffffff);
      a_04->magnitude = 1;
      a_04->normalized = 0;
      secp256k1_fe_verify(a_04);
      return;
    }
  }
  uStack_118 = auVar97._8_8_;
  uStack_150 = auVar97._0_8_;
  uStack_138 = auVar96._8_8_;
  uStack_d8 = auVar96._0_8_;
  pcStack_158 = secp256k1_ge_to_bytes;
  secp256k1_fe_mul_cold_1();
  pcStack_1b0 = (code *)0x14082a;
  a_03 = a_02;
  psVar114 = a_02;
  psStack_168 = a_01;
  pcStack_158 = (code *)auVar103._0_8_;
  secp256k1_ge_verify(a_02);
  if (a_02->infinity == 0) {
    pcStack_1b0 = (code *)0x14083f;
    secp256k1_ge_to_storage(&sStack_1a8,a_02);
    a_04[1].n[0] = sStack_1a8.y.n[2];
    a_04[1].n[1] = sStack_1a8.y.n[3];
    a_04->n[4] = sStack_1a8.y.n[0];
    a_04->magnitude = (undefined4)sStack_1a8.y.n[1];
    a_04->normalized = sStack_1a8.y.n[1]._4_4_;
    a_04->n[2] = sStack_1a8.x.n[2];
    a_04->n[3] = sStack_1a8.x.n[3];
    a_04->n[0] = sStack_1a8.x.n[0];
    a_04->n[1] = sStack_1a8.x.n[1];
    return;
  }
  pcStack_1b0 = secp256k1_ge_to_storage;
  secp256k1_ge_to_bytes_cold_1();
  a_05 = (secp256k1_ge *)auStack_220;
  psVar112 = a_03;
  r = a_03;
  psStack_1c0 = a_04;
  psStack_1b8 = a_02;
  pcStack_1b0 = (code *)auVar103._0_8_;
  secp256k1_ge_verify(a_03);
  if (a_03->infinity == 0) {
    auStack_220._48_8_ = (a_03->x).n[0];
    uStack_1e8 = (a_03->x).n[1];
    uStack_1e0 = (a_03->x).n[2];
    uStack_1d8 = (a_03->x).n[3];
    uStack_1d0 = (a_03->x).n[4];
    uStack_1c8._0_4_ = (a_03->x).magnitude;
    iStack_1c4 = (a_03->x).normalized;
    r = (secp256k1_ge *)(auStack_220 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r);
    auStack_220._0_8_ = (a_03->y).n[0];
    auStack_220._8_8_ = (a_03->y).n[1];
    auStack_220._16_8_ = (a_03->y).n[2];
    auStack_220._24_8_ = (a_03->y).n[3];
    auStack_220._32_8_ = (a_03->y).n[4];
    auStack_220._40_4_ = (a_03->y).magnitude;
    auStack_220._44_4_ = (a_03->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_220);
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (iStack_1c4 != 0) {
      (psVar114->x).n[0] = uStack_1e8 << 0x34 | auStack_220._48_8_;
      (psVar114->x).n[1] = uStack_1e0 << 0x28 | uStack_1e8 >> 0xc;
      (psVar114->x).n[2] = uStack_1d8 << 0x1c | uStack_1e0 >> 0x18;
      (psVar114->x).n[3] = uStack_1d0 << 0x10 | uStack_1d8 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_220);
      if (auStack_220._44_4_ != 0) {
        (psVar114->x).n[4] = auStack_220._8_8_ << 0x34 | auStack_220._0_8_;
        uVar106 = auStack_220._16_8_ << 0x28 | (ulong)auStack_220._8_8_ >> 0xc;
        (psVar114->x).magnitude = (int)uVar106;
        (psVar114->x).normalized = (int)(uVar106 >> 0x20);
        (psVar114->y).n[0] = auStack_220._24_8_ << 0x1c | (ulong)auStack_220._16_8_ >> 0x18;
        (psVar114->y).n[1] = auStack_220._32_8_ << 0x10 | (ulong)auStack_220._24_8_ >> 0x24;
        return;
      }
      goto LAB_001409c2;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_05 = r;
  secp256k1_ge_to_storage_cold_3();
LAB_001409c2:
  secp256k1_ge_to_storage_cold_2();
  (a_05->x).n[0] = (psVar112->x).n[0] & 0xfffffffffffff;
  (a_05->x).n[1] = ((psVar112->x).n[1] & 0xffffffffff) << 0xc | (psVar112->x).n[0] >> 0x34;
  (a_05->x).n[2] = ((psVar112->x).n[2] & 0xfffffff) << 0x18 | (psVar112->x).n[1] >> 0x28;
  (a_05->x).n[3] = ((psVar112->x).n[3] & 0xffff) << 0x24 | (psVar112->x).n[2] >> 0x1c;
  (a_05->x).n[4] = (psVar112->x).n[3] >> 0x10;
  (a_05->x).magnitude = 1;
  (a_05->x).normalized = 1;
  secp256k1_fe_verify(&a_05->x);
  (a_05->y).n[0] = (psVar112->x).n[4] & 0xfffffffffffff;
  uVar106._0_4_ = (psVar112->x).magnitude;
  uVar106._4_4_ = (psVar112->x).normalized;
  (a_05->y).n[1] = (uVar106 & 0xffffffffff) << 0xc | (psVar112->x).n[4] >> 0x34;
  uVar1._0_4_ = (psVar112->x).magnitude;
  uVar1._4_4_ = (psVar112->x).normalized;
  (a_05->y).n[2] = ((psVar112->y).n[0] & 0xfffffff) << 0x18 | uVar1 >> 0x28;
  (a_05->y).n[3] = ((psVar112->y).n[1] & 0xffff) << 0x24 | (psVar112->y).n[0] >> 0x1c;
  (a_05->y).n[4] = (psVar112->y).n[1] >> 0x10;
  (a_05->y).magnitude = 1;
  (a_05->y).normalized = 1;
  secp256k1_fe_verify(&a_05->y);
  a_05->infinity = 0;
  secp256k1_ge_verify(a_05);
  return;
}

Assistant:

static void secp256k1_ge_verify(const secp256k1_ge *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GE_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GE_Y_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}